

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_flac_get_data_format
                    (ma_flac *pFlac,ma_format *pFormat,ma_uint32 *pChannels,ma_uint32 *pSampleRate,
                    ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_result mVar1;
  
  if (pFormat != (ma_format *)0x0) {
    *pFormat = ma_format_unknown;
  }
  if (pChannels != (ma_uint32 *)0x0) {
    *pChannels = 0;
  }
  if (pSampleRate != (ma_uint32 *)0x0) {
    *pSampleRate = 0;
  }
  if (channelMapCap != 0 && pChannelMap != (ma_channel *)0x0) {
    memset(pChannelMap,0,channelMapCap);
  }
  if (pFlac == (ma_flac *)0x0) {
    mVar1 = MA_INVALID_OPERATION;
  }
  else {
    if (pFormat != (ma_format *)0x0) {
      *pFormat = pFlac->format;
    }
    if (pChannels != (ma_uint32 *)0x0) {
      *pChannels = (uint)pFlac->dr->channels;
    }
    if (pSampleRate != (ma_uint32 *)0x0) {
      *pSampleRate = pFlac->dr->sampleRate;
    }
    if (pChannelMap == (ma_channel *)0x0) {
      mVar1 = MA_SUCCESS;
    }
    else {
      mVar1 = MA_SUCCESS;
      ma_channel_map_init_standard
                (ma_standard_channel_map_default,pChannelMap,channelMapCap,(uint)pFlac->dr->channels
                );
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_flac_get_data_format(ma_flac* pFlac, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    /* Defaults for safety. */
    if (pFormat != NULL) {
        *pFormat = ma_format_unknown;
    }
    if (pChannels != NULL) {
        *pChannels = 0;
    }
    if (pSampleRate != NULL) {
        *pSampleRate = 0;
    }
    if (pChannelMap != NULL) {
        MA_ZERO_MEMORY(pChannelMap, sizeof(*pChannelMap) * channelMapCap);
    }

    if (pFlac == NULL) {
        return MA_INVALID_OPERATION;
    }

    if (pFormat != NULL) {
        *pFormat = pFlac->format;
    }

    #if !defined(MA_NO_FLAC)
    {
        if (pChannels != NULL) {
            *pChannels = pFlac->dr->channels;
        }

        if (pSampleRate != NULL) {
            *pSampleRate = pFlac->dr->sampleRate;
        }

        if (pChannelMap != NULL) {
            ma_channel_map_init_standard(ma_standard_channel_map_microsoft, pChannelMap, channelMapCap, pFlac->dr->channels);
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}